

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O0

void __thiscall
ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
stop(Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
     *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->m);
  this->to_stop = true;
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void stop()
		{
			std::lock_guard<std::mutex> l{m};
			to_stop = true;
		}